

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

uint8_t absl::lts_20250127::strings_internal::CordTestAccess::LengthToTag(size_t s)

{
  char *buffer;
  byte bVar1;
  uint uVar2;
  Nonnull<char_*> pcVar3;
  AlphaNum *in_RCX;
  string death_message;
  string local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  char *local_70;
  AlphaNum local_48;
  
  if (0xff3 < s) {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Check s <= kMaxFlatLength failed: ","");
    local_78 = 0xf;
    local_70 = "Invalid length ";
    buffer = local_48.digits_;
    pcVar3 = numbers_internal::FastIntToBuffer(s,buffer);
    local_48.piece_._M_len = (long)pcVar3 - (long)buffer;
    local_48.piece_._M_str = buffer;
    StrCat_abi_cxx11_(&local_b8,(lts_20250127 *)&local_78,&local_48,in_RCX);
    std::__cxx11::string::_M_append((char *)local_98,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x622,local_98);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x622,
                  "static uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t)");
  }
  uVar2 = (int)s + 0xd;
  bVar1 = (char)(uVar2 >> 6) + 0x3a;
  if (s < 500) {
    bVar1 = (char)(uVar2 >> 3) + 2;
  }
  if (bVar1 < 0xf9) {
    return bVar1;
  }
  __assert_fail("tag <= MAX_FLAT_TAG",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                ,0x5e,"uint8_t absl::cord_internal::AllocatedSizeToTag(size_t)");
}

Assistant:

uint8_t CordTestAccess::LengthToTag(size_t s) {
  ABSL_INTERNAL_CHECK(s <= kMaxFlatLength, absl::StrCat("Invalid length ", s));
  return cord_internal::AllocatedSizeToTag(s + cord_internal::kFlatOverhead);
}